

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O3

bool __thiscall
google::protobuf::MessageLite::SerializeToZeroCopyStream
          (MessageLite *this,ZeroCopyOutputStream *output)

{
  bool bVar1;
  int iVar2;
  LogMessage *pLVar3;
  MessageLite *message;
  LogMessage local_80;
  string local_48;
  LogFinisher local_21;
  
  iVar2 = (*this->_vptr_MessageLite[6])();
  if ((char)iVar2 == '\0') {
    message = (MessageLite *)0x192;
    internal::LogMessage::LogMessage
              (&local_80,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/message_lite.cc"
               ,0x192);
    pLVar3 = internal::LogMessage::operator<<(&local_80,"CHECK failed: IsInitialized(): ");
    (anonymous_namespace)::InitializationErrorMessage_abi_cxx11_
              (&local_48,(_anonymous_namespace_ *)"serialize",(char *)this,message);
    pLVar3 = internal::LogMessage::operator<<(pLVar3,&local_48);
    internal::LogFinisher::operator=(&local_21,pLVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    internal::LogMessage::~LogMessage(&local_80);
  }
  bVar1 = SerializePartialToZeroCopyStream(this,output);
  return bVar1;
}

Assistant:

bool MessageLite::SerializeToZeroCopyStream(
    io::ZeroCopyOutputStream* output) const {
  GOOGLE_DCHECK(IsInitialized()) << InitializationErrorMessage("serialize", *this);
  return SerializePartialToZeroCopyStream(output);
}